

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reliveapp.cpp
# Opt level: O0

ImU32 __thiscall relive::ReLiveApp::colorForString(ReLiveApp *this,string *str)

{
  int iVar1;
  ImU32 IVar2;
  ImVec4 local_38;
  float local_28;
  float local_24;
  float b;
  float g;
  float r;
  uint32_t hash;
  string *str_local;
  ReLiveApp *this_local;
  
  _r = str;
  str_local = (string *)this;
  g = (float)relive::hash(str,this->_nameColorSeed);
  b = 0.0;
  local_24 = 0.0;
  local_28 = 0.0;
  iVar1 = 0x80;
  if ((this->_darkMode & 1U) != 0) {
    iVar1 = 0xff;
  }
  ImGui::ColorConvertHSVtoRGB
            ((float)((uint)g & 0xff) / 255.0,0.5,(float)(int)(iVar1 - ((uint)g >> 8 & 0x1f)) / 255.0
             ,&b,&local_24,&local_28);
  ImVec4::ImVec4(&local_38,b,local_24,local_28,255.0);
  IVar2 = ImGui::ColorConvertFloat4ToU32(&local_38);
  return IVar2;
}

Assistant:

ImU32 ReLiveApp::colorForString(const std::string& str)
{
    auto hash = relive::hash(str, static_cast<uint32_t>(_nameColorSeed));
    float r = 0, g = 0, b = 0;
    ImGui::ColorConvertHSVtoRGB((hash & 0xffu) / 255.0f, 0.5f, ((_darkMode ? 255 : 128) - ((hash >> 8u) & 31u)) / 255.0f, r, g, b);
    return ImGui::ColorConvertFloat4ToU32(ImVec4(r, g, b, 255));
}